

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_FunctionBuilder.h
# Opt level: O0

void __thiscall soul::FunctionBuilder::addReturn(FunctionBuilder *this)

{
  Terminator *t;
  pool_ptr<soul::heart::Block> local_18;
  FunctionBuilder *local_10;
  FunctionBuilder *this_local;
  
  local_10 = this;
  t = &Module::allocate<soul::heart::ReturnVoid>((this->super_BlockBuilder).module)->
       super_Terminator;
  pool_ptr<soul::heart::Block>::pool_ptr(&local_18,(void *)0x0);
  addTerminatorStatement(this,t,&local_18);
  pool_ptr<soul::heart::Block>::~pool_ptr(&local_18);
  return;
}

Assistant:

void addReturn()
    {
        addTerminatorStatement (module.allocate<heart::ReturnVoid>(), nullptr);
    }